

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O1

void MacProj::Initialize(void)

{
  pointer pcVar1;
  ostringstream *poVar2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  ParmParse pp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_mac;
  long *local_260;
  long local_258;
  long local_250 [2];
  ParmParse local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  if ((anonymous_namespace)::initialized == '\0') {
    (anonymous_namespace)::umac_periodic_test_Tol = 0x3ddb7cdfd9d7bdbb;
    verbose = 0;
    mac_tol = 1e-12;
    mac_abs_tol = 1e-16;
    mac_sync_tol = 1e-10;
    do_outflow_bcs = 1;
    check_umac_periodicity = 0;
    pcVar1 = local_1b8 + 0x10;
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"mac_proj","");
    amrex::ParmParse::ParmParse(&local_240,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    amrex::ParmParse::query(&local_240,"verbose",&verbose,0);
    amrex::ParmParse::query(&local_240,"mac_tol",&mac_tol,0);
    amrex::ParmParse::query(&local_240,"mac_abs_tol",&mac_abs_tol,0);
    amrex::ParmParse::query(&local_240,"mac_sync_tol",&mac_sync_tol,0);
    amrex::ParmParse::query(&local_240,"do_outflow_bcs",&do_outflow_bcs,0);
    amrex::ParmParse::query(&local_240,"check_umac_periodicity",&check_umac_periodicity,0);
    amrex::ParmParse::query
              (&local_240,"umac_periodic_test_Tol",
               (double *)&(anonymous_namespace)::umac_periodic_test_Tol,0);
    amrex::ParmParse::query(&local_240,"agglomeration",&Initialize::agglomeration,0);
    amrex::ParmParse::query(&local_240,"consolidation",&Initialize::consolidation,0);
    amrex::ParmParse::query(&local_240,"max_fmg_iter",&Initialize::max_fmg_iter,0);
    amrex::ParmParse::query(&local_240,"maxorder",&Initialize::max_order,0);
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"v","");
    iVar4 = amrex::ParmParse::countname(&local_240,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (0 < iVar4) {
      amrex::Abort_host("mac_proj.v found in inputs. To set verbosity use mac_proj.verbose");
    }
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"mac","");
    amrex::ParmParse::getEntries
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1e8,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (local_1e8._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_1b8._8_8_ = amrex::OutStream();
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "All runtime options related to the mac projection now use \'mac_proj\'.\n",0x46);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Found these depreciated entries in the parameters list: \n",0x39
                );
      amrex::Print::~Print((Print *)local_1b8);
      p_Var3 = &local_1e8._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        p_Var5 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_260 = local_250;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
          local_1b8._8_8_ = amrex::OutStream();
          local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
          local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
               *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_260,local_258);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          amrex::Print::~Print((Print *)local_1b8);
          if (local_260 != local_250) {
            operator_delete(local_260,local_250[0] + 1);
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var3);
      }
      amrex::Abort_host("Replace \'mac\' prefix with \'mac_proj\' in inputs");
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x371190);
    (anonymous_namespace)::initialized = '\x01';
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1e8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_240);
  }
  return;
}

Assistant:

void
MacProj::Initialize ()
{
    if (initialized) return;
    //
    // Set defaults here!!!
    //
    umac_periodic_test_Tol          = 1.e-10;
    MacProj::verbose                = 0;
    MacProj::mac_tol                = 1.0e-12;
    MacProj::mac_abs_tol            = 1.0e-16;
    MacProj::mac_sync_tol           = 1.0e-10;
    MacProj::do_outflow_bcs         = 1;
    //
    // Only check umac periodicity when debugging.  Can be overridden on input.
    //
#ifndef AMREX_DEBUG
    MacProj::check_umac_periodicity = 0;
#else
    MacProj::check_umac_periodicity = 1;
#endif

    // NOTE: IAMR uses a different max_order default than hydro::MacProjector,
    // which uses a default of 3
    static int max_order = 4;
    static int agglomeration = 1;
    static int consolidation = 1;
    static int max_fmg_iter = -1;


    ParmParse pp("mac_proj");

    pp.query("verbose",                verbose);
    pp.query("mac_tol",                mac_tol);
    pp.query("mac_abs_tol",            mac_abs_tol);
    pp.query("mac_sync_tol",           mac_sync_tol);
    pp.query("do_outflow_bcs",         do_outflow_bcs);
    pp.query("check_umac_periodicity", check_umac_periodicity);
    pp.query("umac_periodic_test_Tol", umac_periodic_test_Tol);

    pp.query("agglomeration", agglomeration);
    pp.query("consolidation", consolidation);
    pp.query("max_fmg_iter", max_fmg_iter);
    pp.query( "maxorder"      , max_order );
#ifdef AMREX_USE_HYPRE
    if ( pp.contains("use_hypre") )
      amrex::Abort("use_hypre is no more. To use Hypre set mac_proj.bottom_solver = hypre.");
    if ( pp.contains("hypre_verbose") )
      amrex::Abort("hypre_verbose is no more. To make the bottom solver verbose set mac_proj.bottom_verbose = 1.");
#endif

    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("mac_proj.v found in inputs. To set verbosity use mac_proj.verbose");
    }
    // Abort if old "mac." prefix is used.
    std::set<std::string> old_mac = ParmParse::getEntries("mac");
    if (!old_mac.empty()){
	Print()<<"All runtime options related to the mac projection now use 'mac_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_mac ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'mac' prefix with 'mac_proj' in inputs");
    }

    amrex::ExecOnFinalize(MacProj::Finalize);

    initialized = true;
}